

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

_Bool binary_fuse16_deserialize(binary_fuse16_t *filter,char *buffer)

{
  uint32_t uVar1;
  uint uVar2;
  size_t __size;
  uint16_t *__dest;
  
  filter->Seed = *(uint64_t *)buffer;
  filter->Size = *(uint32_t *)(buffer + 8);
  uVar1 = *(uint32_t *)(buffer + 0xc);
  filter->SegmentLength = uVar1;
  filter->SegmentLengthMask = uVar1 - 1;
  filter->SegmentCount = *(uint32_t *)(buffer + 0x10);
  filter->SegmentCountLength = *(uint32_t *)(buffer + 0x14);
  uVar2 = *(uint *)(buffer + 0x18);
  filter->ArrayLength = uVar2;
  __size = (ulong)uVar2 * 2;
  __dest = (uint16_t *)malloc(__size);
  filter->Fingerprints = __dest;
  if (__dest != (uint16_t *)0x0) {
    memcpy(__dest,buffer + 0x1c,__size);
  }
  return __dest != (uint16_t *)0x0;
}

Assistant:

static inline bool binary_fuse16_deserialize(binary_fuse16_t * filter, const char *buffer) {
  const char* fingerprints = binary_fuse16_deserialize_header(filter, buffer);
  filter->Fingerprints = (uint16_t*)malloc(filter->ArrayLength * sizeof(uint16_t));
  if(filter->Fingerprints == NULL) {
    return false;
  }
  memcpy(filter->Fingerprints, fingerprints, filter->ArrayLength * sizeof(uint16_t));
  return true;
}